

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O3

uint256 * GetPackageHash(uint256 *__return_storage_ptr__,
                        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *transactions)

{
  uchar *puVar1;
  byte bVar2;
  pointer psVar3;
  element_type *peVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  base_blob<256U> *pbVar16;
  iterator iVar17;
  ulong uVar18;
  uchar *puVar19;
  transaction_identifier<true> *ptVar20;
  long lVar21;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__range1;
  __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  __i;
  pointer psVar22;
  long lVar23;
  transaction_identifier<true> *ptVar24;
  transaction_identifier<true> *wtxid;
  uchar *puVar25;
  long in_FS_OFFSET;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> wtxids_copy;
  HashWriter hashwriter;
  transaction_identifier<true> *local_b8;
  iterator iStack_b0;
  transaction_identifier<true> *local_a8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = (transaction_identifier<true> *)0x0;
  iStack_b0._M_current = (transaction_identifier<true> *)0x0;
  local_a8 = (transaction_identifier<true> *)0x0;
  psVar22 = (transactions->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar22 != psVar3) {
    do {
      peVar4 = (psVar22->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_98.s._0_8_ =
           *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_98.s._8_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_98.s._16_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_98.s._24_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      if (iStack_b0._M_current == local_a8) {
        std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
        _M_realloc_insert<transaction_identifier<true>>
                  ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                    *)&local_b8,iStack_b0,(transaction_identifier<true> *)&local_98);
      }
      else {
        uVar5 = *(undefined4 *)
                 (peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined4 *)
                 ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4
                 );
        uVar7 = *(undefined4 *)
                 ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8
                 );
        uVar8 = *(undefined4 *)
                 ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 0xc);
        uVar9 = *(undefined8 *)
                 ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 0x18);
        *(undefined8 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
              );
        *(undefined8 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar9;
        *(undefined4 *)((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems =
             uVar5;
        *(undefined4 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 4) = uVar6;
        *(undefined4 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
        *(undefined4 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar8;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      iVar17._M_current = (transaction_identifier<true> *)iStack_b0;
      ptVar20 = local_b8;
      psVar22 = psVar22 + 1;
    } while (psVar22 != psVar3);
    if (local_b8 != iStack_b0._M_current) {
      lVar23 = (long)iStack_b0._M_current - (long)local_b8;
      uVar18 = lVar23 >> 5;
      lVar21 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                (local_b8,iStack_b0._M_current,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar23 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                  (ptVar20,iVar17._M_current);
      }
      else {
        ptVar24 = ptVar20 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                  (ptVar20,ptVar24);
        if (ptVar24 != iVar17._M_current) {
          puVar25 = ptVar20[0xf].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1f;
LAB_0098a02c:
          uVar9 = *(undefined8 *)(ptVar24->m_wrapped).super_base_blob<256U>.m_data._M_elems;
          uVar10 = *(undefined8 *)((ptVar24->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
          uVar11 = *(undefined8 *)
                    ((ptVar24->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
          uVar12 = *(undefined8 *)
                    ((ptVar24->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
          local_98.s[4] = (uint32_t)uVar11;
          local_98.s[5] = SUB84(uVar11,4);
          local_98.s[6] = (uint32_t)uVar12;
          local_98.s[7] = SUB84(uVar12,4);
          local_98.s[0] = (uint32_t)uVar9;
          local_98.s[1] = SUB84(uVar9,4);
          local_98.s[2] = (uint32_t)uVar10;
          local_98.s[3] = SUB84(uVar10,4);
          puVar19 = puVar25;
          ptVar20 = ptVar24;
          do {
            lVar21 = 0;
            do {
              bVar2 = *(byte *)((long)local_98.s + lVar21 + 0x1f);
              puVar1 = puVar19 + lVar21;
              if (lVar21 == -0x1f) break;
              lVar21 = lVar21 + -1;
            } while (*puVar1 == bVar2);
            if (*puVar1 <= bVar2) goto LAB_0098a07e;
            uVar13 = *(undefined8 *)ptVar20[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar14 = *(undefined8 *)
                      (ptVar20[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar15 = *(undefined8 *)
                      (ptVar20[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)(ptVar20[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
            ;
            *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar15;
            *(undefined8 *)(ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems = uVar13;
            *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar14
            ;
            ptVar20 = ptVar20 + -1;
            puVar19 = puVar19 + -0x20;
          } while( true );
        }
      }
    }
  }
LAB_0098a0a9:
  CSHA256::CSHA256(&local_98);
  iVar17._M_current = (transaction_identifier<true> *)iStack_b0;
  if (local_b8 != iStack_b0._M_current) {
    ptVar20 = local_b8;
    do {
      CSHA256::Write(&local_98,(uchar *)ptVar20,0x20);
      ptVar20 = ptVar20 + 1;
    } while (ptVar20 != iVar17._M_current);
  }
  pbVar16 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar16->m_data)._M_elems[0x10] = '\0';
  (pbVar16->m_data)._M_elems[0x11] = '\0';
  (pbVar16->m_data)._M_elems[0x12] = '\0';
  (pbVar16->m_data)._M_elems[0x13] = '\0';
  (pbVar16->m_data)._M_elems[0x14] = '\0';
  (pbVar16->m_data)._M_elems[0x15] = '\0';
  (pbVar16->m_data)._M_elems[0x16] = '\0';
  (pbVar16->m_data)._M_elems[0x17] = '\0';
  pbVar16 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar16->m_data)._M_elems[0x18] = '\0';
  (pbVar16->m_data)._M_elems[0x19] = '\0';
  (pbVar16->m_data)._M_elems[0x1a] = '\0';
  (pbVar16->m_data)._M_elems[0x1b] = '\0';
  (pbVar16->m_data)._M_elems[0x1c] = '\0';
  (pbVar16->m_data)._M_elems[0x1d] = '\0';
  (pbVar16->m_data)._M_elems[0x1e] = '\0';
  (pbVar16->m_data)._M_elems[0x1f] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar16 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar16->m_data)._M_elems[8] = '\0';
  (pbVar16->m_data)._M_elems[9] = '\0';
  (pbVar16->m_data)._M_elems[10] = '\0';
  (pbVar16->m_data)._M_elems[0xb] = '\0';
  (pbVar16->m_data)._M_elems[0xc] = '\0';
  (pbVar16->m_data)._M_elems[0xd] = '\0';
  (pbVar16->m_data)._M_elems[0xe] = '\0';
  (pbVar16->m_data)._M_elems[0xf] = '\0';
  CSHA256::Finalize(&local_98,(uchar *)__return_storage_ptr__);
  if (local_b8 != (transaction_identifier<true> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
LAB_0098a07e:
  *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar11;
  *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar12;
  *(undefined8 *)(ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems = uVar9;
  *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar10;
  ptVar24 = ptVar24 + 1;
  puVar25 = puVar25 + 0x20;
  if (ptVar24 == iVar17._M_current) goto LAB_0098a0a9;
  goto LAB_0098a02c;
}

Assistant:

uint256 GetPackageHash(const std::vector<CTransactionRef>& transactions)
{
    // Create a vector of the wtxids.
    std::vector<Wtxid> wtxids_copy;
    std::transform(transactions.cbegin(), transactions.cend(), std::back_inserter(wtxids_copy),
        [](const auto& tx){ return tx->GetWitnessHash(); });

    // Sort in ascending order
    std::sort(wtxids_copy.begin(), wtxids_copy.end(), [](const auto& lhs, const auto& rhs) {
        return std::lexicographical_compare(std::make_reverse_iterator(lhs.end()), std::make_reverse_iterator(lhs.begin()),
                                            std::make_reverse_iterator(rhs.end()), std::make_reverse_iterator(rhs.begin()));
    });

    // Get sha256 hash of the wtxids concatenated in this order
    HashWriter hashwriter;
    for (const auto& wtxid : wtxids_copy) {
        hashwriter << wtxid;
    }
    return hashwriter.GetSHA256();
}